

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseStorage.h
# Opt level: O3

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_max_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::Matrix<double,-1,1,0,-1,1>>,3,0>
       ::run<Eigen::Matrix<double,_1,1,0,_1,1>>
                 (redux_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *eval,
                 scalar_max_op<double,_double,_0> *func,Matrix<double,__1,_1,_0,__1,_1> *xpr)

{
  ulong uVar1;
  undefined1 (*pauVar2) [16];
  double dVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  Scalar elements [2];
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  uVar1 = (xpr->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  uVar5 = uVar1 + 3;
  if (-1 < (long)uVar1) {
    uVar5 = uVar1;
  }
  pauVar2 = (undefined1 (*) [16])
            (eval->super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
            super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.
            data;
  if (uVar1 + 1 < 3) {
    return *(Scalar *)*pauVar2;
  }
  uVar4 = uVar1 - ((long)uVar1 >> 0x3f) & 0xfffffffffffffffe;
  auVar8 = *pauVar2;
  if (3 < (long)uVar1) {
    uVar5 = uVar5 & 0xfffffffffffffffc;
    auVar9 = pauVar2[1];
    if (7 < uVar1) {
      lVar6 = 4;
      do {
        auVar8 = maxpd(*(undefined1 (*) [16])(*pauVar2 + lVar6 * 8),auVar8);
        auVar9 = maxpd(*(undefined1 (*) [16])(pauVar2[1] + lVar6 * 8),auVar9);
        lVar6 = lVar6 + 4;
      } while (lVar6 < (long)uVar5);
    }
    auVar8 = maxpd(auVar9,auVar8);
    if ((long)uVar5 < (long)uVar4) {
      auVar8 = maxpd(*(undefined1 (*) [16])(*pauVar2 + uVar5 * 8),auVar8);
    }
  }
  dVar7 = auVar8._8_8_;
  if (auVar8._8_8_ <= auVar8._0_8_) {
    dVar7 = auVar8._0_8_;
  }
  if ((long)uVar1 <= (long)uVar4) {
    return dVar7;
  }
  do {
    dVar3 = *(double *)(*pauVar2 + uVar4 * 8);
    if (*(double *)(*pauVar2 + uVar4 * 8) <= dVar7) {
      dVar3 = dVar7;
    }
    uVar4 = uVar4 + 1;
    dVar7 = dVar3;
  } while (uVar1 != uVar4);
  return dVar3;
}

Assistant:

EIGEN_DEVICE_FUNC Index rows(void) const EIGEN_NOEXCEPT {return m_rows;}